

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O0

size_t ZSTD_compressBlock_fast_extDict_generic
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 U32 mls)

{
  U32 hBits;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  U32 *pUVar5;
  BYTE *pBVar6;
  BYTE *pBVar7;
  int iVar8;
  BYTE *mEnd;
  uint uVar9;
  uint uVar10;
  U32 UVar11;
  U32 UVar12;
  uint uVar13;
  U32 UVar14;
  U32 UVar15;
  BYTE *iStart;
  BYTE *pBVar16;
  BYTE *iEnd;
  BYTE *pBVar17;
  size_t sVar18;
  size_t sVar19;
  bool bVar20;
  BYTE *local_1b8;
  BYTE *local_1a8;
  BYTE *local_178;
  BYTE *local_160;
  BYTE *local_150;
  BYTE *local_148;
  U32 tmpOffset;
  size_t repLength2;
  BYTE *repEnd2;
  BYTE *repMatch2;
  U32 repIndex2;
  U32 current2;
  U32 offset;
  BYTE *lowMatchPtr;
  BYTE *matchEnd;
  BYTE *repMatchEnd;
  size_t mLength;
  BYTE *repMatch;
  BYTE *repBase;
  U32 repIndex;
  U32 current;
  BYTE *match;
  BYTE *matchBase;
  U32 matchIndex;
  size_t h;
  U32 offset_2;
  U32 offset_1;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *dictEnd;
  BYTE *prefixStart;
  U32 prefixStartIndex;
  BYTE *dictStart;
  BYTE *pBStack_78;
  U32 dictStartIndex;
  BYTE *anchor;
  BYTE *ip;
  BYTE *istart;
  BYTE *dictBase;
  BYTE *base;
  U32 stepSize;
  U32 hlog;
  U32 *hashTable;
  ZSTD_compressionParameters *cParams;
  U32 mls_local;
  size_t srcSize_local;
  void *src_local;
  U32 *rep_local;
  seqStore_t *seqStore_local;
  ZSTD_matchState_t *ms_local;
  
  pUVar5 = ms->hashTable;
  hBits = (ms->cParams).hashLog;
  uVar1 = (ms->cParams).targetLength;
  uVar2 = (ms->cParams).targetLength;
  pBVar6 = (ms->window).base;
  pBVar7 = (ms->window).dictBase;
  uVar3 = (ms->window).lowLimit;
  uVar4 = (ms->window).dictLimit;
  iStart = pBVar6 + uVar4;
  pBVar16 = pBVar7 + uVar4;
  iEnd = (BYTE *)((long)src + srcSize);
  pBVar17 = iEnd + -8;
  h._4_4_ = *rep;
  h._0_4_ = rep[1];
  pBStack_78 = (BYTE *)src;
  anchor = (BYTE *)src;
LAB_007c054e:
  do {
    if (pBVar17 <= anchor) {
      *rep = h._4_4_;
      rep[1] = (U32)h;
      return (long)iEnd - (long)pBStack_78;
    }
    sVar18 = ZSTD_hashPtr(anchor,hBits,mls);
    uVar13 = pUVar5[sVar18];
    local_148 = pBVar6;
    if (uVar13 < uVar4) {
      local_148 = pBVar7;
    }
    _repIndex = local_148 + uVar13;
    iVar8 = (int)pBVar6;
    uVar9 = (int)anchor - iVar8;
    uVar10 = (uVar9 + 1) - h._4_4_;
    local_150 = pBVar6;
    if (uVar10 < uVar4) {
      local_150 = pBVar7;
    }
    pUVar5[sVar18] = uVar9;
    if (2 < (uVar4 - 1) - uVar10 && uVar3 < uVar10) {
      UVar11 = MEM_read32(local_150 + uVar10);
      UVar12 = MEM_read32(anchor + 1);
      if (UVar11 != UVar12) goto LAB_007c076b;
      local_160 = iEnd;
      if (uVar10 < uVar4) {
        local_160 = pBVar16;
      }
      sVar18 = ZSTD_count_2segments(anchor + 5,local_150 + uVar10 + 4,iEnd,local_160,iStart);
      repMatchEnd = (BYTE *)(sVar18 + 4);
      anchor = anchor + 1;
      ZSTD_storeSeq(seqStore,(long)anchor - (long)pBStack_78,pBStack_78,0,sVar18 + 1);
LAB_007c0952:
      pBStack_78 = repMatchEnd + (long)anchor;
      anchor = pBStack_78;
      if (pBStack_78 <= pBVar17) {
        sVar18 = ZSTD_hashPtr(pBVar6 + (ulong)uVar9 + 2,hBits,mls);
        pUVar5[sVar18] = uVar9 + 2;
        sVar18 = ZSTD_hashPtr(pBStack_78 + -2,hBits,mls);
        pUVar5[sVar18] = ((int)pBStack_78 + -2) - iVar8;
        for (; UVar11 = (U32)h, pBStack_78 = anchor, anchor <= pBVar17; anchor = anchor + sVar18 + 4
            ) {
          UVar12 = (int)anchor - iVar8;
          uVar13 = UVar12 - (U32)h;
          if (uVar13 < uVar4) {
            local_1a8 = pBVar7 + uVar13;
          }
          else {
            local_1a8 = pBVar6 + uVar13;
          }
          if ((uVar4 - 1) - uVar13 < 3 || uVar13 <= uVar3) break;
          UVar14 = MEM_read32(local_1a8);
          UVar15 = MEM_read32(anchor);
          if (UVar14 != UVar15) break;
          local_1b8 = iEnd;
          if (uVar13 < uVar4) {
            local_1b8 = pBVar16;
          }
          sVar18 = ZSTD_count_2segments(anchor + 4,local_1a8 + 4,iEnd,local_1b8,iStart);
          h._0_4_ = h._4_4_;
          h._4_4_ = UVar11;
          ZSTD_storeSeq(seqStore,0,anchor,0,sVar18 + 1);
          sVar19 = ZSTD_hashPtr(anchor,hBits,mls);
          pUVar5[sVar19] = UVar12;
        }
      }
      goto LAB_007c054e;
    }
LAB_007c076b:
    if (uVar3 <= uVar13) {
      UVar11 = MEM_read32(_repIndex);
      UVar12 = MEM_read32(anchor);
      if (UVar11 == UVar12) {
        local_178 = iStart;
        mEnd = iEnd;
        if (uVar13 < uVar4) {
          local_178 = pBVar7 + uVar3;
          mEnd = pBVar16;
        }
        sVar18 = ZSTD_count_2segments(anchor + 4,_repIndex + 4,iEnd,mEnd,iStart);
        repMatchEnd = (BYTE *)(sVar18 + 4);
        while( true ) {
          bVar20 = false;
          if (pBStack_78 < anchor && local_178 < _repIndex) {
            bVar20 = anchor[-1] == _repIndex[-1];
          }
          if (!bVar20) break;
          anchor = anchor + -1;
          _repIndex = _repIndex + -1;
          repMatchEnd = repMatchEnd + 1;
        }
        h._0_4_ = h._4_4_;
        ZSTD_storeSeq(seqStore,(long)anchor - (long)pBStack_78,pBStack_78,(uVar9 - uVar13) + 2,
                      (size_t)(repMatchEnd + -3));
        h._4_4_ = uVar9 - uVar13;
        goto LAB_007c0952;
      }
    }
    anchor = anchor + ((long)anchor - (long)pBStack_78 >> 8) +
                      (ulong)(uVar1 + ((uVar2 != 0 ^ 0xffU) & 1));
  } while( true );
}

Assistant:

static size_t ZSTD_compressBlock_fast_extDict_generic(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize, U32 const mls)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32* const hashTable = ms->hashTable;
    U32 const hlog = cParams->hashLog;
    /* support stepSize of 0 */
    U32 const stepSize = cParams->targetLength + !(cParams->targetLength);
    const BYTE* const base = ms->window.base;
    const BYTE* const dictBase = ms->window.dictBase;
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* ip = istart;
    const BYTE* anchor = istart;
    const U32   dictStartIndex = ms->window.lowLimit;
    const BYTE* const dictStart = dictBase + dictStartIndex;
    const U32   prefixStartIndex = ms->window.dictLimit;
    const BYTE* const prefixStart = base + prefixStartIndex;
    const BYTE* const dictEnd = dictBase + prefixStartIndex;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = iend - 8;
    U32 offset_1=rep[0], offset_2=rep[1];

    /* Search Loop */
    while (ip < ilimit) {  /* < instead of <=, because (ip+1) */
        const size_t h = ZSTD_hashPtr(ip, hlog, mls);
        const U32    matchIndex = hashTable[h];
        const BYTE* const matchBase = matchIndex < prefixStartIndex ? dictBase : base;
        const BYTE*  match = matchBase + matchIndex;
        const U32    current = (U32)(ip-base);
        const U32    repIndex = current + 1 - offset_1;
        const BYTE* const repBase = repIndex < prefixStartIndex ? dictBase : base;
        const BYTE* const repMatch = repBase + repIndex;
        size_t mLength;
        hashTable[h] = current;   /* update hash table */
        assert(offset_1 <= current +1);   /* check repIndex */

        if ( (((U32)((prefixStartIndex-1) - repIndex) >= 3) /* intentional underflow */ & (repIndex > dictStartIndex))
           && (MEM_read32(repMatch) == MEM_read32(ip+1)) ) {
            const BYTE* repMatchEnd = repIndex < prefixStartIndex ? dictEnd : iend;
            mLength = ZSTD_count_2segments(ip+1+4, repMatch+4, iend, repMatchEnd, prefixStart) + 4;
            ip++;
            ZSTD_storeSeq(seqStore, ip-anchor, anchor, 0, mLength-MINMATCH);
        } else {
            if ( (matchIndex < dictStartIndex) ||
                 (MEM_read32(match) != MEM_read32(ip)) ) {
                assert(stepSize >= 1);
                ip += ((ip-anchor) >> kSearchStrength) + stepSize;
                continue;
            }
            {   const BYTE* matchEnd = matchIndex < prefixStartIndex ? dictEnd : iend;
                const BYTE* lowMatchPtr = matchIndex < prefixStartIndex ? dictStart : prefixStart;
                U32 offset;
                mLength = ZSTD_count_2segments(ip+4, match+4, iend, matchEnd, prefixStart) + 4;
                while (((ip>anchor) & (match>lowMatchPtr)) && (ip[-1] == match[-1])) { ip--; match--; mLength++; }   /* catch up */
                offset = current - matchIndex;
                offset_2 = offset_1;
                offset_1 = offset;
                ZSTD_storeSeq(seqStore, ip-anchor, anchor, offset + ZSTD_REP_MOVE, mLength-MINMATCH);
        }   }

        /* found a match : store it */
        ip += mLength;
        anchor = ip;

        if (ip <= ilimit) {
            /* Fill Table */
            hashTable[ZSTD_hashPtr(base+current+2, hlog, mls)] = current+2;
            hashTable[ZSTD_hashPtr(ip-2, hlog, mls)] = (U32)(ip-2-base);
            /* check immediate repcode */
            while (ip <= ilimit) {
                U32 const current2 = (U32)(ip-base);
                U32 const repIndex2 = current2 - offset_2;
                const BYTE* repMatch2 = repIndex2 < prefixStartIndex ? dictBase + repIndex2 : base + repIndex2;
                if ( (((U32)((prefixStartIndex-1) - repIndex2) >= 3) & (repIndex2 > dictStartIndex))  /* intentional overflow */
                   && (MEM_read32(repMatch2) == MEM_read32(ip)) ) {
                    const BYTE* const repEnd2 = repIndex2 < prefixStartIndex ? dictEnd : iend;
                    size_t const repLength2 = ZSTD_count_2segments(ip+4, repMatch2+4, iend, repEnd2, prefixStart) + 4;
                    U32 tmpOffset = offset_2; offset_2 = offset_1; offset_1 = tmpOffset;   /* swap offset_2 <=> offset_1 */
                    ZSTD_storeSeq(seqStore, 0, anchor, 0, repLength2-MINMATCH);
                    hashTable[ZSTD_hashPtr(ip, hlog, mls)] = current2;
                    ip += repLength2;
                    anchor = ip;
                    continue;
                }
                break;
    }   }   }

    /* save reps for next block */
    rep[0] = offset_1;
    rep[1] = offset_2;

    /* Return the last literals size */
    return iend - anchor;
}